

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O1

ssize_t __thiscall Label::read(Label *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  size_t __nbytes_00;
  size_t __nbytes_01;
  size_t __nbytes_02;
  void *__buf_00;
  undefined4 in_register_00000034;
  uint8_t *puVar4;
  uint8_t *buf;
  int tmp;
  HorizontalAlignment local_2c;
  
  iVar1 = Util::readString((uint8_t *)CONCAT44(in_register_00000034,__fd),&this->text);
  puVar4 = (uint8_t *)CONCAT44(in_register_00000034,__fd) + iVar1;
  Color::read((int)puVar4,&this->textColor,__nbytes_00);
  sVar3 = FontData::read(__fd + iVar1 + 0x10,&this->font,__nbytes_01);
  puVar4 = puVar4 + (long)(int)sVar3 + 0x10;
  iVar1 = Util::readInt32(puVar4,(int *)&local_2c);
  this->textTrimming = local_2c;
  iVar2 = Util::readInt32(puVar4 + iVar1,(int *)&local_2c);
  buf = puVar4 + iVar1 + iVar2;
  this->lineBreak = local_2c;
  iVar1 = Util::readBool(buf,&this->hasTextShadow);
  puVar4 = buf + iVar1;
  TextShadow::read((int)puVar4,&this->textShadow,__nbytes_02);
  iVar1 = Util::readInt32(buf + (long)iVar1 + 0x18,(int *)&local_2c);
  puVar4 = puVar4 + (long)iVar1 + 0x18;
  this->horizontalAlignment = local_2c;
  iVar1 = Util::readInt32(puVar4,(int *)&local_2c);
  puVar4 = puVar4 + iVar1;
  this->verticalAlignment = local_2c;
  iVar1 = Util::readBool(puVar4,&this->enableBaselineY);
  iVar2 = Util::readFloat32(puVar4 + iVar1,&this->topbaselineY);
  sVar3 = Widget::read(&this->super_Widget,iVar2 + (int)(puVar4 + iVar1),__buf_00,__nbytes);
  return sVar3;
}

Assistant:

uint8_t* Label::read(uint8_t* buf)
{
	buf += Util::readString(buf, text);
	buf += Color::read(buf, textColor);
	buf += FontData::read(buf, font);
	
	int tmp;
	buf += Util::readInt32(buf, tmp);
	textTrimming = static_cast<TextTrimming>(tmp);
	buf += Util::readInt32(buf, tmp);
	lineBreak = static_cast<LineBreak>(tmp);
	buf += Util::readBool(buf, hasTextShadow);
	buf += TextShadow::read(buf, textShadow);
	buf += Util::readInt32(buf, tmp);
	horizontalAlignment = static_cast<HorizontalAlignment>(tmp);
	buf += Util::readInt32(buf, tmp);
	verticalAlignment = static_cast<VerticalAlignment>(tmp);

	buf += Util::readBool(buf, enableBaselineY);
	buf += Util::readFloat32(buf, topbaselineY);

	return Widget::read(buf);
}